

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlUnlinkNodeInternal(xmlNodePtr cur)

{
  _xmlNode *p_Var1;
  xmlNodePtr parent;
  xmlNodePtr cur_local;
  
  if (cur->parent != (_xmlNode *)0x0) {
    p_Var1 = cur->parent;
    if (cur->type == XML_ATTRIBUTE_NODE) {
      if ((xmlNodePtr)p_Var1->properties == cur) {
        p_Var1->properties = (_xmlAttr *)cur->next;
      }
    }
    else {
      if (p_Var1->children == cur) {
        p_Var1->children = cur->next;
      }
      if (p_Var1->last == cur) {
        p_Var1->last = cur->prev;
      }
    }
    cur->parent = (_xmlNode *)0x0;
  }
  if (cur->next != (_xmlNode *)0x0) {
    cur->next->prev = cur->prev;
  }
  if (cur->prev != (_xmlNode *)0x0) {
    cur->prev->next = cur->next;
  }
  cur->next = (_xmlNode *)0x0;
  cur->prev = (_xmlNode *)0x0;
  return;
}

Assistant:

static void
xmlUnlinkNodeInternal(xmlNodePtr cur) {
    if (cur->parent != NULL) {
	xmlNodePtr parent;
	parent = cur->parent;
	if (cur->type == XML_ATTRIBUTE_NODE) {
	    if (parent->properties == (xmlAttrPtr) cur)
		parent->properties = ((xmlAttrPtr) cur)->next;
	} else {
	    if (parent->children == cur)
		parent->children = cur->next;
	    if (parent->last == cur)
		parent->last = cur->prev;
	}
	cur->parent = NULL;
    }

    if (cur->next != NULL)
        cur->next->prev = cur->prev;
    if (cur->prev != NULL)
        cur->prev->next = cur->next;
    cur->next = NULL;
    cur->prev = NULL;
}